

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O2

void __thiscall
random_tests::xoroshiro128plusplus_reference_values::test_method
          (xoroshiro128plusplus_reference_values *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar4;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  lazy_ostream local_c0;
  undefined1 *local_b0;
  char **local_a8;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  local_a0;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  InsecureRandomContext rng;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  InsecureRandomContext::InsecureRandomContext(&rng,0);
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xf6;
  file.m_begin = (iterator)&local_68;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0x6f68e1e7e2646ee1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_90,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_a0,false);
  local_d0 = "0x6f68e1e7e2646ee1 == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_d8 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_0000000e;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,_cVar4,(size_t)&local_e0,0xf6);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xf7;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0xbf971b7f454094ad;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_90,&local_a0,false);
  local_d0 = "0xbf971b7f454094ad == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_108 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_0000000e;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,_cVar4,(size_t)&local_110,0xf7);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xf8;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0x48f2de556f30de38;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_90,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_a0,false);
  local_d0 = "0x48f2de556f30de38 == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_138 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_0000000e;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,_cVar4,(size_t)&local_140,0xf8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xf9;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0x6ea7c59f89bbfc75;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_90,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_a0,false);
  local_d0 = "0x6ea7c59f89bbfc75 == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_168 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_0000000e;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,_cVar4,(size_t)&local_170,0xf9);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  InsecureRandomContext::Reseed(&rng,0x1a26f3fa8546b47a);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xfd;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0xc8dc5e08d844ac7d;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_90,&local_a0,false);
  local_d0 = "0xc8dc5e08d844ac7d == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_198 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_0000000e;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,_cVar4,(size_t)&local_1a0,0xfd);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xfe;
  file_04.m_begin = (iterator)&local_1b0;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c0,
             msg_04);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0x5b5f1f6d499dad1b;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
  ::evaluate(&local_90,
             (binary_expr<boost::test_tools::assertion::value_expr<long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<long,_unsigned_long,_void>_>
              *)&local_a0,false);
  local_d0 = "0x5b5f1f6d499dad1b == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1c8 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_0000000e;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,_cVar4,(size_t)&local_1d0,0xfe);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xff;
  file_05.m_begin = (iterator)&local_1e0;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1f0,
             msg_05);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0xbeb0031f93313d6f;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_90,&local_a0,false);
  local_d0 = "0xbeb0031f93313d6f == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1f8 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_0000000e;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,_cVar4,(size_t)&local_200,0xff);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x100;
  file_06.m_begin = (iterator)&local_210;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_220,
             msg_06);
  local_a0.m_rhs = InsecureRandomContext::rand64(&rng);
  local_a0.m_lhs.m_value = 0xbfbcf4f43a264497;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_90,&local_a0,false);
  local_d0 = "0xbfbcf4f43a264497 == rng()";
  local_c8 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_c0,1,0xe,WARN,0xbcd7e0,(size_t)&stack0xfffffffffffffdd0,0x100);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(xoroshiro128plusplus_reference_values)
{
    // numbers generated from reference implementation
    InsecureRandomContext rng(0);
    BOOST_TEST(0x6f68e1e7e2646ee1 == rng());
    BOOST_TEST(0xbf971b7f454094ad == rng());
    BOOST_TEST(0x48f2de556f30de38 == rng());
    BOOST_TEST(0x6ea7c59f89bbfc75 == rng());

    // seed with a random number
    rng.Reseed(0x1a26f3fa8546b47a);
    BOOST_TEST(0xc8dc5e08d844ac7d == rng());
    BOOST_TEST(0x5b5f1f6d499dad1b == rng());
    BOOST_TEST(0xbeb0031f93313d6f == rng());
    BOOST_TEST(0xbfbcf4f43a264497 == rng());
}